

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cvodes_io.c
# Opt level: O1

int CVodeGetSensNumNonlinSolvConvFails(void *cvode_mem,long *nSnfails)

{
  int line;
  int iVar1;
  int error_code;
  char *msgfmt;
  
  if (cvode_mem == (void *)0x0) {
    msgfmt = "cvode_mem = NULL illegal.";
    iVar1 = -0x15;
    cvode_mem = (CVodeMem)0x0;
    error_code = -0x15;
    line = 0x90a;
  }
  else {
    if (*(int *)((long)cvode_mem + 0x8c) != 0) {
      *nSnfails = *(long *)((long)cvode_mem + 0x698);
      return 0;
    }
    msgfmt = "Forward sensitivity analysis not activated.";
    iVar1 = -0x28;
    error_code = -0x28;
    line = 0x912;
  }
  cvProcessError((CVodeMem)cvode_mem,error_code,line,"CVodeGetSensNumNonlinSolvConvFails",
                 "/workspace/llm4binary/github/license_all_cmakelists_25/opencor[P]sundials/src/cvodes/cvodes_io.c"
                 ,msgfmt);
  return iVar1;
}

Assistant:

int CVodeGetSensNumNonlinSolvConvFails(void* cvode_mem, long int* nSnfails)
{
  CVodeMem cv_mem;

  if (cvode_mem == NULL)
  {
    cvProcessError(NULL, CV_MEM_NULL, __LINE__, __func__, __FILE__, MSGCV_NO_MEM);
    return (CV_MEM_NULL);
  }

  cv_mem = (CVodeMem)cvode_mem;

  if (cv_mem->cv_sensi == SUNFALSE)
  {
    cvProcessError(cv_mem, CV_NO_SENS, __LINE__, __func__, __FILE__,
                   MSGCV_NO_SENSI);
    return (CV_NO_SENS);
  }

  *nSnfails = cv_mem->cv_nnfS;

  return (CV_SUCCESS);
}